

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_array.c
# Opt level: O0

void tabread_float(t_tabread *x,t_float f)

{
  int iVar1;
  t_float local_44;
  int local_34;
  t_word *ptStack_30;
  int n;
  t_word *vec;
  _garray *p_Stack_20;
  int npoints;
  _garray *a;
  t_tabread *ptStack_10;
  t_float f_local;
  t_tabread *x_local;
  
  a._4_4_ = f;
  ptStack_10 = x;
  p_Stack_20 = (_garray *)pd_findbyclass(x->x_arrayname,garray_class);
  if (p_Stack_20 == (_garray *)0x0) {
    pd_error(ptStack_10,"%s: no such array",ptStack_10->x_arrayname->s_name);
  }
  else {
    iVar1 = garray_getfloatwords(p_Stack_20,(int *)((long)&vec + 4),&stack0xffffffffffffffd0);
    if (iVar1 == 0) {
      pd_error(ptStack_10,"%s: bad template for tabread",ptStack_10->x_arrayname->s_name);
    }
    else {
      local_34 = (int)a._4_4_;
      if (local_34 < 0) {
        local_34 = 0;
      }
      else if (vec._4_4_ <= local_34) {
        local_34 = vec._4_4_ + -1;
      }
      if (vec._4_4_ == 0) {
        local_44 = 0.0;
      }
      else {
        local_44 = ptStack_30[local_34].w_float;
      }
      outlet_float((ptStack_10->x_obj).te_outlet,local_44);
    }
  }
  return;
}

Assistant:

static void tabread_float(t_tabread *x, t_float f)
{
    t_garray *a;
    int npoints;
    t_word *vec;

    if (!(a = (t_garray *)pd_findbyclass(x->x_arrayname, garray_class)))
        pd_error(x, "%s: no such array", x->x_arrayname->s_name);
    else if (!garray_getfloatwords(a, &npoints, &vec))
        pd_error(x, "%s: bad template for tabread", x->x_arrayname->s_name);
    else
    {
        int n = f;
        if (n < 0) n = 0;
        else if (n >= npoints) n = npoints - 1;
        outlet_float(x->x_obj.ob_outlet, (npoints ? vec[n].w_float : 0));
    }
}